

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall
CSmoothTime::Update(CSmoothTime *this,CGraph *pGraph,int64 Target,int TimeLeft,int AdjustDirection)

{
  int iVar1;
  int64 Now;
  int64 iVar2;
  uint uVar3;
  float fVar4;
  
  if (TimeLeft < 0) {
    if (TimeLeft < -0x32) {
      iVar1 = 0x32;
      if (this->m_SpikeCounter < 0x2e) {
        iVar1 = this->m_SpikeCounter + 5;
      }
      this->m_SpikeCounter = iVar1;
      if (iVar1 < 0xf) {
        iVar1 = pGraph->m_Index;
        uVar3 = iVar1 + 0x80;
        if (-1 < (int)(iVar1 + 1U)) {
          uVar3 = iVar1 + 1U;
        }
        iVar1 = (iVar1 - (uVar3 & 0xffffff80)) + 1;
        pGraph->m_Index = iVar1;
        pGraph->m_aValues[iVar1] = (float)TimeLeft;
        *(float *)((long)(pGraph->m_aColors + iVar1) + 0) = 1.0;
        *(float *)((long)(pGraph->m_aColors + iVar1) + 4) = 1.0;
        pGraph->m_aColors[iVar1][2] = 0.3;
        this->m_BadnessScore = this->m_BadnessScore + 10;
        goto LAB_0011eb75;
      }
    }
    iVar1 = pGraph->m_Index;
    uVar3 = iVar1 + 0x80;
    if (-1 < (int)(iVar1 + 1U)) {
      uVar3 = iVar1 + 1U;
    }
    iVar1 = (iVar1 - (uVar3 & 0xffffff80)) + 1;
    pGraph->m_Index = iVar1;
    pGraph->m_aValues[iVar1] = (float)TimeLeft;
    *(float *)((long)(pGraph->m_aColors + iVar1) + 0) = 1.0;
    *(float *)((long)(pGraph->m_aColors + iVar1) + 4) = 0.3;
    pGraph->m_aColors[iVar1][2] = 0.3;
    this->m_BadnessScore = this->m_BadnessScore + 0x32;
    fVar4 = this->m_aAdjustSpeed[AdjustDirection];
    if (fVar4 < 30.0) {
      this->m_aAdjustSpeed[AdjustDirection] = fVar4 + fVar4;
    }
  }
  else {
    if (this->m_SpikeCounter != 0) {
      this->m_SpikeCounter = this->m_SpikeCounter + -1;
    }
    iVar1 = pGraph->m_Index;
    uVar3 = iVar1 + 0x80;
    if (-1 < (int)(iVar1 + 1U)) {
      uVar3 = iVar1 + 1U;
    }
    iVar1 = (iVar1 - (uVar3 & 0xffffff80)) + 1;
    pGraph->m_Index = iVar1;
    pGraph->m_aValues[iVar1] = (float)TimeLeft;
    *(float *)((long)(pGraph->m_aColors + iVar1) + 0) = 0.3;
    *(float *)((long)(pGraph->m_aColors + iVar1) + 4) = 1.0;
    pGraph->m_aColors[iVar1][2] = 0.3;
    fVar4 = this->m_aAdjustSpeed[AdjustDirection] * 0.95;
    this->m_aAdjustSpeed[AdjustDirection] = fVar4;
    if (fVar4 < 2.0) {
      this->m_aAdjustSpeed[AdjustDirection] = 2.0;
    }
  }
  Now = time_get();
  iVar2 = Get(this,Now);
  this->m_Current = iVar2;
  this->m_Snap = Now;
  this->m_Target = Target;
LAB_0011eb75:
  this->m_BadnessScore = ~(this->m_BadnessScore / 100) + this->m_BadnessScore;
  return;
}

Assistant:

void CSmoothTime::Update(CGraph *pGraph, int64 Target, int TimeLeft, int AdjustDirection)
{
	int UpdateTimer = 1;

	if(TimeLeft < 0)
	{
		int IsSpike = 0;
		if(TimeLeft < -50)
		{
			IsSpike = 1;

			m_SpikeCounter += 5;
			if(m_SpikeCounter > 50)
				m_SpikeCounter = 50;
		}

		if(IsSpike && m_SpikeCounter < 15)
		{
			// ignore this ping spike
			UpdateTimer = 0;
			pGraph->Add(TimeLeft, 1,1,0.3f); // yellow
			m_BadnessScore += 10;
		}
		else
		{
			pGraph->Add(TimeLeft, 1,0.3f,0.3f); // red
			m_BadnessScore += 50;
			if(m_aAdjustSpeed[AdjustDirection] < 30.0f)
				m_aAdjustSpeed[AdjustDirection] *= 2.0f;
		}
	}
	else
	{
		if(m_SpikeCounter)
			m_SpikeCounter--;

		pGraph->Add(TimeLeft, 0.3f,1,0.3f); // green

		m_aAdjustSpeed[AdjustDirection] *= 0.95f;
		if(m_aAdjustSpeed[AdjustDirection] < 2.0f)
			m_aAdjustSpeed[AdjustDirection] = 2.0f;
	}

	if(UpdateTimer)
		UpdateInt(Target);

	m_BadnessScore -= 1+m_BadnessScore/100;
}